

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.h
# Opt level: O2

void __thiscall
gimage::Polygon::draw<unsigned_char>
          (Polygon *this,Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,float r,
          float g,float b)

{
  pointer pSVar1;
  pointer pSVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  
  pSVar1 = (this->vertex).
           super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->vertex).
           super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = 8;
  uVar3 = ((long)pSVar2 - (long)pSVar1 >> 4) - 1;
  for (uVar4 = 0; uVar4 < (ulong)((long)pSVar2 - (long)pSVar1 >> 4); uVar4 = uVar4 + 1) {
    drawLine<unsigned_char>
              (image,*(long *)((long)pSVar1->v + lVar5 + -8),*(long *)((long)pSVar1->v + lVar5),
               pSVar1[uVar3].v[0],pSVar1[uVar3].v[1],r,g,b);
    pSVar1 = (this->vertex).
             super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pSVar2 = (this->vertex).
             super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    lVar5 = lVar5 + 0x10;
    uVar3 = uVar4;
  }
  return;
}

Assistant:

void draw(Image<T> &image, float r, float g=-1, float b=-1) const
    {
      size_t j=vertex.size()-1;
      for (size_t i=0; i<vertex.size(); i++)
      {
        drawLine(image, vertex[i][0], vertex[i][1], vertex[j][0], vertex[j][1], r, g, b);
        j=i;
      }
    }